

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::testTextId(Test *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  Report report;
  QFile file;
  
  QString::QString((QString *)&report,":/textid.xml");
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x2c);
  if (cVar2 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    QString::QString((QString *)&local_48,"1");
    QString::QString((QString *)&local_60,"Ti");
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QString::QString((QString *)&local_48,"2");
    QString::QString((QString *)&local_60,"tle");
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QString::QString((QString *)&local_48,"3");
    QString::QString((QString *)&local_60,"textid.xml");
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    bVar1 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x31);
    if (cVar2 != '\0') {
      KDReports::Report::mainTextDocument();
      iVar3 = QTextDocument::blockCount();
      cVar2 = QTest::qCompare(iVar3,4,"report.mainTextDocument()->blockCount()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x32);
      if (cVar2 != '\0') {
        KDReports::Report::mainTextDocument();
        QTextDocument::toPlainText();
        QString::QString((QString *)&local_60,"Title .\ntextid.xml\n\n");
        bVar1 = QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                "report.mainTextDocument()->toPlainText()",
                                "QString(\"Title .\\ntextid.xml\\n\\n\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x33);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        if (bVar1) {
          QString::QString((QString *)&local_48,"1");
          QString::QString((QString *)&local_60,"New Ti");
          KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          KDReports::Report::mainTextDocument();
          QTextDocument::toPlainText();
          QString::QString((QString *)&local_60,"New Title .\ntextid.xml\n\n");
          bVar1 = QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                  "report.mainTextDocument()->toPlainText()",
                                  "QString(\"New Title .\\ntextid.xml\\n\\n\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x37);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          if (bVar1) {
            QString::QString((QString *)&local_48,"3");
            QString::QString((QString *)&local_60,"changed");
            KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            KDReports::Report::mainTextDocument();
            QTextDocument::toPlainText();
            QString::QString((QString *)&local_60,"New Title .\nchanged\n\n");
            bVar1 = QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                    "report.mainTextDocument()->toPlainText()",
                                    "QString(\"New Title .\\nchanged\\n\\n\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                    ,0x3a);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            if (bVar1) {
              QString::QString((QString *)&local_48,"1");
              QString::QString((QString *)&local_60,"Newer Ti");
              KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
              KDReports::Report::mainTextDocument();
              QTextDocument::toPlainText();
              QString::QString((QString *)&local_60,"Newer Title .\nchanged\n\n");
              bVar1 = QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                      "report.mainTextDocument()->toPlainText()",
                                      "QString(\"Newer Title .\\nchanged\\n\\n\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                      ,0x3c);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
              if (bVar1) {
                QString::QString((QString *)&local_48,"5");
                QString::QString((QString *)&local_60,"well");
                KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
                KDReports::Report::mainTextDocument();
                QTextDocument::toPlainText();
                QString::QString((QString *)&local_60,"Newer Title .\nchanged\n\nwell");
                bVar1 = QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                        "report.mainTextDocument()->toPlainText()",
                                        "QString(\"Newer Title .\\nchanged\\n\\nwell\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                        ,0x3f);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
                if (bVar1) {
                  QString::QString((QString *)&local_48,"4");
                  QString::QString((QString *)&local_60,"works");
                  KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_48);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
                  KDReports::Report::mainTextDocument();
                  QTextDocument::toPlainText();
                  QString::QString((QString *)&local_60,"Newer Title .\nchanged\nworks\nwell");
                  QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                  "report.mainTextDocument()->toPlainText()",
                                  "QString(\"Newer Title .\\nchanged\\nworks\\nwell\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x42);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
                }
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void testTextId()
    {
        QFile file(":/textid.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        report.associateTextValue("1", "Ti");
        report.associateTextValue("2", "tle");
        report.associateTextValue("3", "textid.xml");
        QVERIFY(report.loadFromXML(&file));
        QCOMPARE(report.mainTextDocument()->blockCount(), 4);
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Title .\ntextid.xml\n\n"));

        // Now test changing text values -after- loading.
        report.associateTextValue("1", "New Ti");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("New Title .\ntextid.xml\n\n"));

        report.associateTextValue("3", "changed");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("New Title .\nchanged\n\n"));
        report.associateTextValue("1", "Newer Ti");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\n\n"));

        report.associateTextValue("5", "well");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\n\nwell"));

        report.associateTextValue("4", "works");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\nworks\nwell"));
    }